

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

void sse_w4x4_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m256i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  undefined1 (*in_R8) [32];
  undefined8 in_XMM0_Qa;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 in_XMM0_Qb;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  __m256i v_d_w;
  __m256i v_b_w;
  __m256i v_a_w;
  __m128i v_b0123;
  __m128i v_a0123;
  __m128i v_b3;
  __m128i v_b2;
  __m128i v_b1;
  __m128i v_b0;
  __m128i v_a3;
  __m128i v_a2;
  __m128i v_a1;
  __m128i v_a0;
  
  xx_loadl_32(in_RDI);
  uVar11 = in_XMM0_Qa;
  uVar18 = in_XMM0_Qb;
  xx_loadl_32((void *)((long)in_RDI + (long)in_ESI));
  uVar12 = uVar11;
  uVar19 = uVar18;
  xx_loadl_32((void *)((long)in_RDI + (long)(in_ESI * 2)));
  uVar13 = uVar12;
  uVar20 = uVar19;
  xx_loadl_32((void *)((long)in_RDI + (long)(in_ESI * 3)));
  uVar14 = uVar13;
  uVar21 = uVar20;
  xx_loadl_32(in_RDX);
  uVar15 = uVar14;
  uVar22 = uVar21;
  xx_loadl_32((void *)((long)in_RDX + (long)in_ECX));
  uVar16 = uVar15;
  uVar23 = uVar22;
  xx_loadl_32((void *)((long)in_RDX + (long)(in_ECX * 2)));
  uVar17 = uVar16;
  uVar24 = uVar23;
  xx_loadl_32((void *)((long)in_RDX + (long)(in_ECX * 3)));
  auVar10._8_8_ = in_XMM0_Qb;
  auVar10._0_8_ = in_XMM0_Qa;
  auVar9._8_8_ = uVar18;
  auVar9._0_8_ = uVar11;
  auVar1 = vpunpckldq_avx(auVar10,auVar9);
  auVar8._8_8_ = uVar19;
  auVar8._0_8_ = uVar12;
  auVar3._8_8_ = uVar20;
  auVar3._0_8_ = uVar13;
  auVar2 = vpunpckldq_avx(auVar8,auVar3);
  auVar3 = vpunpcklqdq_avx(auVar1,auVar2);
  auVar7._8_8_ = uVar21;
  auVar7._0_8_ = uVar14;
  auVar1._8_8_ = uVar22;
  auVar1._0_8_ = uVar15;
  auVar1 = vpunpckldq_avx(auVar7,auVar1);
  auVar6._8_8_ = uVar23;
  auVar6._0_8_ = uVar16;
  auVar2._8_8_ = uVar24;
  auVar2._0_8_ = uVar17;
  auVar2 = vpunpckldq_avx(auVar6,auVar2);
  auVar1 = vpunpcklqdq_avx(auVar1,auVar2);
  auVar4 = vpmovzxbw_avx2(auVar3);
  auVar5 = vpmovzxbw_avx2(auVar1);
  auVar4 = vpsubw_avx2(auVar4,auVar5);
  auVar4 = vpmaddwd_avx2(auVar4,auVar4);
  auVar4 = vpaddd_avx2(*in_R8,auVar4);
  *in_R8 = auVar4;
  return;
}

Assistant:

static inline void sse_w4x4_avx2(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m256i *sum) {
  const __m128i v_a0 = xx_loadl_32(a);
  const __m128i v_a1 = xx_loadl_32(a + a_stride);
  const __m128i v_a2 = xx_loadl_32(a + a_stride * 2);
  const __m128i v_a3 = xx_loadl_32(a + a_stride * 3);
  const __m128i v_b0 = xx_loadl_32(b);
  const __m128i v_b1 = xx_loadl_32(b + b_stride);
  const __m128i v_b2 = xx_loadl_32(b + b_stride * 2);
  const __m128i v_b3 = xx_loadl_32(b + b_stride * 3);
  const __m128i v_a0123 = _mm_unpacklo_epi64(_mm_unpacklo_epi32(v_a0, v_a1),
                                             _mm_unpacklo_epi32(v_a2, v_a3));
  const __m128i v_b0123 = _mm_unpacklo_epi64(_mm_unpacklo_epi32(v_b0, v_b1),
                                             _mm_unpacklo_epi32(v_b2, v_b3));
  const __m256i v_a_w = _mm256_cvtepu8_epi16(v_a0123);
  const __m256i v_b_w = _mm256_cvtepu8_epi16(v_b0123);
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}